

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

void deallocateVecOfIntVec(Vec_Ptr_t *vecOfIntVec)

{
  Vec_Int_t *p;
  int i;
  
  if (vecOfIntVec != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < vecOfIntVec->nSize; i = i + 1) {
      p = (Vec_Int_t *)Vec_PtrEntry(vecOfIntVec,i);
      Vec_IntFree(p);
    }
    Vec_PtrFree(vecOfIntVec);
    return;
  }
  return;
}

Assistant:

void deallocateVecOfIntVec( Vec_Ptr_t *vecOfIntVec )
{
	Vec_Int_t *vInt;
	int i;

	if( vecOfIntVec )
	{
		Vec_PtrForEachEntry( Vec_Int_t *, vecOfIntVec, vInt, i )
		{
			Vec_IntFree( vInt );
		}
		Vec_PtrFree(vecOfIntVec);
	}	
}